

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

void __thiscall RenX::Server::banCheck(Server *this)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->players &&
      (this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
      _M_node._M_size != 0) {
    do {
      if (*(char *)&p_Var1[0x11]._M_next == '\0') {
        banCheck(this,(PlayerInfo *)(p_Var1 + 1));
      }
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)&this->players);
  }
  return;
}

Assistant:

void RenX::Server::banCheck() {
	if (this->players.size() != 0) {
		for (auto node = this->players.begin(); node != this->players.end(); ++node) {
			if (node->isBot == false) {
				banCheck(*node);
			}
		}
	}
}